

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstantValue.h
# Opt level: O2

string * __thiscall
flow::
ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>
::to_string(string *__return_storage_ptr__,
           ConstantValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(flow::LiteralType)3>
           *this)

{
  string_view format_str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe8;
  LiteralType local_c;
  
  local_c = (this->super_Constant).super_Value.type_;
  format_str.size_ = (size_t)&(this->super_Constant).super_Value.name_;
  format_str.data_ = (char *)0x16;
  fmt::v5::format<std::__cxx11::string,flow::LiteralType,std::__cxx11::string>
            (__return_storage_ptr__,(v5 *)"Constant \'{}\': {} = {}",format_str,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &stack0xfffffffffffffff4,(LiteralType *)&this->value_,in_stack_ffffffffffffffe8);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string() const override {
    return fmt::format("Constant '{}': {} = {}", name(), type(), value_);
  }